

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_command_line_params.cpp
# Opt level: O0

int __thiscall
crnlib::command_line_params::get_value_as_int
          (command_line_params *this,char *pKey,uint index,int def,int l,int h,uint value_index)

{
  bool bVar1;
  uint uVar2;
  pointer ppVar3;
  dynamic_string *this_00;
  bool bVar4;
  char *local_50;
  char *p;
  param_map_const_iterator pStack_40;
  int val;
  _Self local_38;
  param_map_const_iterator it;
  int h_local;
  int l_local;
  int def_local;
  uint index_local;
  char *pKey_local;
  command_line_params *this_local;
  
  it._M_node._0_4_ = h;
  it._M_node._4_4_ = l;
  local_38._M_node = (_Base_ptr)get_param(this,pKey,index);
  pStack_40 = end(this);
  bVar1 = std::operator==(&local_38,&stack0xffffffffffffffc0);
  bVar4 = true;
  if (!bVar1) {
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>
             ::operator->(&local_38);
    uVar2 = vector<crnlib::dynamic_string>::size(&(ppVar3->second).m_values);
    bVar4 = uVar2 <= value_index;
  }
  this_local._4_4_ = def;
  if (!bVar4) {
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>
             ::operator->(&local_38);
    this_00 = vector<crnlib::dynamic_string>::operator[](&(ppVar3->second).m_values,value_index);
    local_50 = dynamic_string::get_ptr(this_00);
    bVar4 = string_to_int(&local_50,(int *)((long)&p + 4));
    if (bVar4) {
      if ((int)p._4_4_ < (int)it._M_node._4_4_) {
        console::warning("Value %i for parameter \"%s\" is out of range, clamping to %i",
                         (ulong)p._4_4_,pKey,(ulong)it._M_node._4_4_);
        p._4_4_ = it._M_node._4_4_;
      }
      else if ((int)(uint)it._M_node < (int)p._4_4_) {
        console::warning("Value %i for parameter \"%s\" is out of range, clamping to %i",
                         (ulong)p._4_4_,pKey,(ulong)(uint)it._M_node);
        p._4_4_ = (uint)it._M_node;
      }
      this_local._4_4_ = p._4_4_;
    }
    else {
      console::warning("Invalid value specified for parameter \"%s\", using default value of %i",
                       pKey,(ulong)(uint)def);
    }
  }
  return this_local._4_4_;
}

Assistant:

int command_line_params::get_value_as_int(const char* pKey, uint index, int def, int l, int h, uint value_index) const
    {
        param_map_const_iterator it = get_param(pKey, index);
        if ((it == end()) || (value_index >= it->second.m_values.size()))
        {
            return def;
        }

        int val;
        const char* p = it->second.m_values[value_index].get_ptr();
        if (!string_to_int(p, val))
        {
            crnlib::console::warning("Invalid value specified for parameter \"%s\", using default value of %i", pKey, def);
            return def;
        }

        if (val < l)
        {
            crnlib::console::warning("Value %i for parameter \"%s\" is out of range, clamping to %i", val, pKey, l);
            val = l;
        }
        else if (val > h)
        {
            crnlib::console::warning("Value %i for parameter \"%s\" is out of range, clamping to %i", val, pKey, h);
            val = h;
        }

        return val;
    }